

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O2

void __thiscall
SQCompilation::SQCompilationContext::vreportDiagnostic
          (SQCompilationContext *this,DiagnosticsId diagId,int32_t line,int32_t pos,int32_t width,
          __va_list_tag *vargs)

{
  int iVar1;
  SQSharedState *pSVar2;
  SQCOMPILERERROR p_Var3;
  SQ_COMPILER_DIAG_CB p_Var4;
  _Alloc_hider s;
  bool bVar5;
  byte *l;
  byte *pbVar6;
  byte *l_00;
  SQString *x;
  _Alloc_hider _Var7;
  SQMessageSeverity SVar8;
  int iVar9;
  long lVar10;
  byte *pbVar11;
  int iVar12;
  string extraInfo;
  string message;
  SQCompilerMessage cm;
  
  bVar5 = isDisabled(this,diagId,line,pos);
  if (!bVar5) {
    lVar10 = (ulong)diagId * 0x28;
    iVar1 = *(int *)(diagnosticDescriptors + lVar10 + 8);
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    vrenderDiagnosticHeader(diagId,&message,vargs);
    extraInfo._M_dataplus._M_p = (pointer)&extraInfo.field_2;
    extraInfo._M_string_length = 0;
    extraInfo.field_2._M_local_buf[0] = '\0';
    l = (byte *)findLine(this,line + -1);
    pbVar6 = (byte *)findLine(this,line);
    l_00 = (byte *)findLine(this,line + 1);
    bVar5 = isBlankLine((char *)l);
    if (!bVar5) {
      std::__cxx11::string::push_back((char)&extraInfo);
      pbVar11 = l;
      while ((0xd < *pbVar11 || ((0x2401U >> (*pbVar11 & 0x1f) & 1) == 0))) {
        pbVar11 = pbVar11 + 1;
        std::__cxx11::string::push_back((char)&extraInfo);
      }
    }
    if (pbVar6 != (byte *)0x0) {
      std::__cxx11::string::push_back((char)&extraInfo);
      pbVar11 = pbVar6;
      while ((0xd < *pbVar11 || ((0x2401U >> (*pbVar11 & 0x1f) & 1) == 0))) {
        pbVar11 = pbVar11 + 1;
        std::__cxx11::string::push_back((char)&extraInfo);
      }
      std::__cxx11::string::push_back((char)&extraInfo);
      iVar12 = 0;
      if (0 < pos) {
        iVar12 = pos;
      }
      iVar9 = iVar12;
      while (bVar5 = iVar9 != 0, iVar9 = iVar9 + -1, bVar5) {
        std::__cxx11::string::push_back((char)&extraInfo);
      }
      iVar12 = iVar12 - pos;
      do {
        std::__cxx11::string::push_back((char)&extraInfo);
        iVar12 = iVar12 + 1;
      } while (iVar12 < width);
    }
    bVar5 = isBlankLine((char *)l_00);
    if (!bVar5) {
      std::__cxx11::string::push_back((char)&extraInfo);
      pbVar11 = l_00;
      while ((0xd < *pbVar11 || ((0x2401U >> (*pbVar11 & 0x1f) & 1) == 0))) {
        pbVar11 = pbVar11 + 1;
        std::__cxx11::string::push_back((char)&extraInfo);
      }
    }
    if (((pbVar6 == (byte *)0x0) && (l == (byte *)0x0)) && (l_00 == (byte *)0x0)) {
      _Var7._M_p = (SQChar *)0x0;
    }
    else {
      std::__cxx11::string::push_back((char)&extraInfo);
      std::__cxx11::string::push_back((char)&extraInfo);
      _Var7 = extraInfo._M_dataplus;
    }
    s._M_p = message._M_dataplus._M_p;
    pSVar2 = this->_vm->_sharedstate;
    p_Var3 = pSVar2->_compilererrorhandler;
    p_Var4 = pSVar2->_compilerdiaghandler;
    if (p_Var4 != (SQ_COMPILER_DIAG_CB)0x0) {
      cm.intId = *(int *)(diagnosticDescriptors + lVar10 + 0x10);
      cm.textId = *(char **)(diagnosticDescriptors + lVar10 + 0x18);
      cm.message = message._M_dataplus._M_p;
      cm.fileName = this->_sourceName;
      cm.line = line;
      cm.column = pos;
      cm.columnsWidth = width;
      cm.isError = 1 < iVar1;
      (*p_Var4)(this->_vm,&cm);
    }
    if ((this->_raiseError == true) && (p_Var3 != (SQCOMPILERERROR)0x0)) {
      SVar8 = (*(int *)(diagnosticDescriptors + lVar10 + 8) != 1) + SEV_WARNING;
      if (*(int *)(diagnosticDescriptors + lVar10 + 8) == 0) {
        SVar8 = SEV_HINT;
      }
      (*p_Var3)(this->_vm,SVar8,s._M_p,this->_sourceName,(long)line,(long)pos,_Var7._M_p);
    }
    if (1 < iVar1) {
      x = SQString::Create(this->_vm->_sharedstate,s._M_p,message._M_string_length);
      SQObjectPtr::operator=(&this->_vm->_lasterror,x);
      std::__cxx11::string::~string((string *)&extraInfo);
      std::__cxx11::string::~string((string *)&message);
      longjmp((__jmp_buf_tag *)this->_errorjmp,1);
    }
    std::__cxx11::string::~string((string *)&extraInfo);
    std::__cxx11::string::~string((string *)&message);
  }
  return;
}

Assistant:

void SQCompilationContext::vreportDiagnostic(enum DiagnosticsId diagId, int32_t line, int32_t pos, int32_t width, va_list vargs) {
  assert(diagId < DI_NUM_OF_DIAGNOSTICS);

  bool doJump = false;

  if (!isDisabled(diagId, line, pos)) {

    auto &desc = diagnosticDescriptors[diagId];
    bool isError = desc.severity >= DS_ERROR;
    std::string message;

    vrenderDiagnosticHeader(diagId, message, vargs);

    std::string extraInfo;

    const char *l1 = findLine(line - 1);
    const char *l2 = findLine(line);
    const char *l3 = findLine(line + 1);

    if (!isBlankLine(l1)) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l1[j] && l1[j] != '\n' && l1[j] != '\r') { //-V522
        extraInfo.push_back(l1[j++]); //-V595
      }
    }

    if (l2 != nullptr) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l2[j] && l2[j] != '\n' && l2[j] != '\r') { //-V522
        extraInfo.push_back(l2[j++]); //-V595
      }

      extraInfo.push_back('\n');
      j = 0;

      drawUnderliner(pos, width, extraInfo);
    }

    if (!isBlankLine(l3)) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l3[j] && l3[j] != '\n' && l3[j] != '\r') { //-V522
        extraInfo.push_back(l3[j++]); //-V595
      }
    }

    const char *extra = nullptr;
    if (l1 || l2 || l3) {
      extraInfo.push_back('\n');
      extraInfo.push_back('\n'); // separate with extra line
      extra = extraInfo.c_str();
    }

    auto messageFunc = _ss(_vm)->_compilererrorhandler;

    const char *msg = message.c_str();

    auto diagMsgFunc = _ss(_vm)->_compilerdiaghandler;
    if (diagMsgFunc) {
      SQCompilerMessage cm;
      cm.intId = desc.id;
      cm.textId = desc.textId;
      cm.line = line;
      cm.column = pos;
      cm.columnsWidth = width;
      cm.message = msg;
      cm.fileName = _sourceName;
      cm.isError = isError;
      diagMsgFunc(_vm, &cm);
    }

    if (_raiseError && messageFunc) {
      SQMessageSeverity sev = SEV_ERROR;
      if (desc.severity == DS_HINT) sev = SEV_HINT;
      else if (desc.severity == DS_WARNING) sev = SEV_WARNING;
      messageFunc(_vm, sev, msg, _sourceName, line, pos, extra);
    }
    if (isError) {
      _vm->_lasterror = SQString::Create(_ss(_vm), msg, message.length());
      doJump = true;
    }
  }
  if (doJump)
    longjmp(_errorjmp, 1);
}